

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner_unix.cpp
# Opt level: O0

void __thiscall trun::DirScanner::DirScanner(DirScanner *this)

{
  ILogger *pIVar1;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  value_type local_30;
  DirScanner *local_10;
  DirScanner *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->extensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->filenames);
  this->recurse = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,".so",&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->extensions,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"DirScanner",&local_69);
  pIVar1 = gnilk::Logger::GetLogger(&local_68);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

DirScanner::DirScanner() {
    this->recurse = true;
#ifdef APPLE
    extensions.push_back(".dylib");
#else
    extensions.push_back(".so");
#endif
    pLogger = gnilk::Logger::GetLogger("DirScanner");
}